

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O0

void __thiscall
libtorrent::block_cache::block_cache
          (block_cache *this,io_service *ios,function<void_()> *trigger_trim)

{
  linked_list<libtorrent::cached_piece_entry,_void> *local_38;
  function<void_()> *trigger_trim_local;
  io_service *ios_local;
  block_cache *this_local;
  
  disk_buffer_pool::disk_buffer_pool(&this->super_disk_buffer_pool,ios,trigger_trim);
  std::
  unordered_set<libtorrent::cached_piece_entry,_libtorrent::block_cache::hash_value,_std::equal_to<libtorrent::cached_piece_entry>,_std::allocator<libtorrent::cached_piece_entry>_>
  ::unordered_set(&this->m_pieces);
  local_38 = this->m_lru;
  do {
    linked_list<libtorrent::cached_piece_entry,_void>::linked_list(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (linked_list<libtorrent::cached_piece_entry,_void> *)&this->m_last_cache_op);
  this->m_last_cache_op = 0;
  this->m_ghost_size = 8;
  this->m_max_volatile_blocks = 100;
  this->m_volatile_size = 0;
  this->m_read_cache_size = 0;
  this->m_write_cache_size = 0;
  this->m_send_buffer_blocks = 0;
  this->m_pinned_blocks = 0;
  return;
}

Assistant:

block_cache::block_cache(io_service& ios
	, std::function<void()> const& trigger_trim)
	: disk_buffer_pool(ios, trigger_trim)
	, m_last_cache_op(cache_miss)
	, m_ghost_size(8)
	, m_max_volatile_blocks(100)
	, m_volatile_size(0)
	, m_read_cache_size(0)
	, m_write_cache_size(0)
	, m_send_buffer_blocks(0)
	, m_pinned_blocks(0)
{
}